

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

void __thiscall
fuzzFailures_rtripconversions5_Test::~fuzzFailures_rtripconversions5_Test
          (fuzzFailures_rtripconversions5_Test *this)

{
  fuzzFailures_rtripconversions5_Test *this_local;
  
  ~fuzzFailures_rtripconversions5_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fuzzFailures, rtripconversions5)
{
    std::string tstring = "ya\xb2";
    tstring += '0';
    auto u1 = unit_from_string(tstring);
    EXPECT_FALSE(is_error(u1));
    auto str = to_string(u1);
    auto u2 = unit_from_string(str);
    EXPECT_FALSE(is_error(u2));
    EXPECT_EQ(u2, u1);
}